

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::RGBFilm::AddSplat(RGBFilm *this,Point2f *p,SampledSpectrum L,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  initializer_list<float> __l;
  bool bVar2;
  Point2i p_00;
  Pixel *pPVar3;
  char (*in_RDI) [13];
  float fVar4;
  Float FVar5;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar17 [64];
  RGB RVar19;
  SampledSpectrum SVar20;
  int i;
  Pixel *pixel;
  Float wt;
  Point2i pi;
  Bounds2iIterator __end1;
  Bounds2iIterator __begin1;
  Bounds2i *__range1;
  Bounds2i splatBounds;
  Vector2f radius;
  Point2f pDiscrete;
  Float m;
  RGB rgb;
  SampledSpectrum H;
  float in_stack_fffffffffffffe38;
  float in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  Float in_stack_fffffffffffffe44;
  Bounds2iIterator *in_stack_fffffffffffffe48;
  Bounds2iIterator *in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe88 [16];
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  int c;
  undefined8 in_stack_fffffffffffffea0;
  LogLevel level;
  SampledWavelengths *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  Bounds2iIterator local_110;
  Tuple2<pbrt::Point2,_int> *local_100;
  Bounds2<int> local_f4;
  undefined8 local_dc;
  undefined8 local_d4;
  Tuple2<pbrt::Point2,_int> local_c4;
  undefined8 local_bc;
  undefined8 local_b4;
  Tuple2<pbrt::Point2,_int> local_a4;
  Tuple2<pbrt::Point2,_int> local_9c;
  undefined8 local_94;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar21;
  undefined4 uVar22;
  Float FVar23;
  RGB local_44;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar16 [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 auVar18 [56];
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  auVar18 = in_ZMM1._8_56_;
  local_10 = vmovlpd_avx(in_ZMM0._0_16_);
  local_8 = vmovlpd_avx(in_ZMM1._0_16_);
  bVar2 = SampledSpectrum::HasNaNs((SampledSpectrum *)in_stack_fffffffffffffe48);
  if (bVar2) {
    LogFatal<char_const(&)[13]>
              (level,(char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffe88._12_4_,in_stack_fffffffffffffe88._0_8_,in_RDI);
  }
  PixelSensor::ImagingRatio(*(PixelSensor **)(in_RDI[3] + 1));
  auVar16 = extraout_var;
  SVar20 = SampledSpectrum::operator*
                     ((SampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                      in_stack_fffffffffffffe3c);
  auVar17._0_8_ = SVar20.values.values._8_8_;
  auVar17._8_56_ = auVar18;
  auVar6._0_8_ = SVar20.values.values._0_8_;
  auVar6._8_56_ = auVar16;
  local_38 = vmovlpd_avx(auVar6._0_16_);
  local_30 = vmovlpd_avx(auVar17._0_16_);
  RVar19 = PixelSensor::ToSensorRGB
                     ((PixelSensor *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      (SampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                      in_stack_fffffffffffffeb0);
  local_44.b = RVar19.b;
  auVar7._0_8_ = RVar19._0_8_;
  auVar7._8_56_ = auVar16;
  local_44._0_8_ = vmovlpd_avx(auVar7._0_16_);
  __l._M_array._4_4_ = in_stack_fffffffffffffe3c;
  __l._M_array._0_4_ = in_stack_fffffffffffffe38;
  __l._M_len._0_4_ = in_stack_fffffffffffffe40;
  __l._M_len._4_4_ = in_stack_fffffffffffffe44;
  FVar23 = local_44.r;
  fVar4 = std::max<float>(__l);
  if (*(float *)(in_RDI[6] + 10) < fVar4) {
    SampledSpectrum::operator*=
              ((SampledSpectrum *)in_stack_fffffffffffffe50,
               (Float)((ulong)in_stack_fffffffffffffe48 >> 0x20));
    RGB::operator*=(&local_44,*(float *)(in_RDI[6] + 10) / fVar4);
  }
  Vector2<float>::Vector2
            ((Vector2<float> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
  auVar8._0_8_ = Point2<float>::operator+
                           ((Point2<float> *)
                            CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                            (Vector2<float> *)0x6afc1f);
  auVar8._8_56_ = extraout_var_00;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  uVar21 = (undefined4)uVar1;
  uVar22 = (undefined4)((ulong)uVar1 >> 0x20);
  auVar9._0_8_ = FilterHandle::Radius
                           ((FilterHandle *)
                            CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  auVar9._8_56_ = extraout_var_01;
  local_94 = vmovlpd_avx(auVar9._0_16_);
  auVar10._0_8_ =
       Point2<float>::operator-
                 ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                  (Vector2<float> *)0x6afc5e);
  auVar10._8_56_ = extraout_var_02;
  local_bc = vmovlpd_avx(auVar10._0_16_);
  auVar11._0_8_ =
       Floor<pbrt::Point2,float>
                 ((Tuple2<pbrt::Point2,_float> *)
                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  auVar11._8_56_ = extraout_var_03;
  local_b4 = vmovlpd_avx(auVar11._0_16_);
  Point2<int>::Point2<float>
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (Point2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  auVar12._0_8_ =
       Point2<float>::operator+
                 ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                  (Vector2<float> *)0x6afca1);
  auVar12._8_56_ = extraout_var_04;
  local_dc = vmovlpd_avx(auVar12._0_16_);
  auVar13._0_8_ =
       Floor<pbrt::Point2,float>
                 ((Tuple2<pbrt::Point2,_float> *)
                  CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  auVar13._8_56_ = extraout_var_05;
  local_d4 = vmovlpd_avx(auVar13._0_16_);
  Point2<int>::Point2<float>
            ((Point2<int> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (Point2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  Vector2<int>::Vector2
            ((Vector2<int> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (int)in_stack_fffffffffffffe3c,(int)in_stack_fffffffffffffe38);
  local_c4 = (Tuple2<pbrt::Point2,_int>)
             Point2<int>::operator+
                       ((Point2<int> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38)
                        ,(Vector2<int> *)0x6afcfe);
  Bounds2<int>::Bounds2
            ((Bounds2<int> *)in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->p,
             (Point2<int> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  local_f4 = Intersect<int>((Bounds2<int> *)in_stack_fffffffffffffe50,
                            (Bounds2<int> *)in_stack_fffffffffffffe48);
  local_a4 = local_f4.pMin.super_Tuple2<pbrt::Point2,_int>;
  local_9c = local_f4.pMax.super_Tuple2<pbrt::Point2,_int>;
  local_100 = &local_a4;
  local_110 = pbrt::begin((Bounds2i *)0x6afd86);
  pbrt::end((Bounds2i *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  while (bVar2 = Bounds2iIterator::operator!=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48),
        bVar2) {
    p_00 = Bounds2iIterator::operator*(&local_110);
    auVar14._0_8_ =
         Point2<float>::operator-
                   ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                    (Point2<int> *)0x6afe0c);
    auVar14._8_56_ = extraout_var_06;
    vmovlpd_avx(auVar14._0_16_);
    in_stack_fffffffffffffe50 = (Bounds2iIterator *)&stack0xfffffffffffffeb4;
    Vector2<float>::Vector2
              ((Vector2<float> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    auVar15._0_8_ =
         Tuple2<pbrt::Vector2,float>::operator-
                   ((Tuple2<pbrt::Vector2,_float> *)
                    CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                    (Vector2<float> *)0x6afe42);
    auVar15._8_56_ = extraout_var_07;
    vmovlpd_avx(auVar15._0_16_);
    Point2<float>::Point2<float>
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (Vector2<float> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    FVar5 = FilterHandle::Evaluate
                      ((FilterHandle *)in_stack_fffffffffffffe50,
                       (Point2f *)in_stack_fffffffffffffe48);
    if ((FVar5 != 0.0) || (NAN(FVar5))) {
      pPVar3 = Array2D<pbrt::RGBFilm::Pixel>::operator[]
                         ((Array2D<pbrt::RGBFilm::Pixel> *)(in_RDI[10] + 6),p_00);
      for (c = 0; c < 3; c = c + 1) {
        in_stack_fffffffffffffe48 = (Bounds2iIterator *)(pPVar3->splatRGB + c);
        in_stack_fffffffffffffe44 = FVar5;
        RGB::operator[](&local_44,c);
        AtomicDouble::Add((AtomicDouble *)CONCAT44(FVar23,uVar22),
                          (double)CONCAT44(uVar21,in_stack_ffffffffffffff78));
      }
    }
    Bounds2iIterator::operator++
              ((Bounds2iIterator *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  return;
}

Assistant:

void RGBFilm::AddSplat(const Point2f &p, SampledSpectrum L,
                       const SampledWavelengths &lambda) {
    CHECK(!L.HasNaNs());
    // Convert sample radiance to _PixelSensor_ RGB
    SampledSpectrum H = L * sensor->ImagingRatio();
    RGB rgb = sensor->ToSensorRGB(H, lambda);

    // Optionally clamp sensor RGB value
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue) {
        H *= maxComponentValue / m;
        rgb *= maxComponentValue / m;
    }

    // Compute bounds of affected pixels for splat, _splatBounds_
    Point2f pDiscrete = p + Vector2f(0.5, 0.5);
    Vector2f radius = filter.Radius();
    Bounds2i splatBounds(Point2i(Floor(pDiscrete - radius)),
                         Point2i(Floor(pDiscrete + radius)) + Vector2i(1, 1));
    splatBounds = Intersect(splatBounds, pixelBounds);

    for (Point2i pi : splatBounds) {
        // Evaluate filter at _pi_ and add splat contribution
        Float wt = filter.Evaluate(Point2f(p - pi - Vector2f(0.5, 0.5)));
        if (wt != 0) {
            Pixel &pixel = pixels[pi];
            for (int i = 0; i < 3; ++i)
                pixel.splatRGB[i].Add(wt * rgb[i]);
        }
    }
}